

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

Value * duckdb::ScalarFunctionExtractor::GetParameterTypes
                  (Value *__return_storage_ptr__,ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  reference this;
  size_type __n;
  vector<duckdb::Value,_true> results;
  ScalarFunction fun;
  pointer local_1b8;
  pointer pVStack_1b0;
  pointer local_1a8;
  Value *local_1a0;
  string local_198;
  vector<duckdb::Value,_true> local_178;
  ScalarFunction local_158;
  
  local_1b8 = (pointer)0x0;
  pVStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  local_1a0 = __return_storage_ptr__;
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_158,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  if (local_158.super_BaseScalarFunction.super_SimpleFunction.arguments.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_158.super_BaseScalarFunction.super_SimpleFunction.arguments.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this = vector<duckdb::LogicalType,_true>::operator[]
                       (&local_158.super_BaseScalarFunction.super_SimpleFunction.arguments,__n);
      LogicalType::ToString_abi_cxx11_(&local_198,this);
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)local_158.super_BaseScalarFunction.super_SimpleFunction.arguments.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_158.super_BaseScalarFunction.super_SimpleFunction.arguments.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  LogicalType::LogicalType((LogicalType *)&local_198,VARCHAR);
  local_178.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_1b8;
  local_178.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_1b0;
  local_178.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_1a8;
  local_1b8 = (pointer)0x0;
  pVStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  Value::LIST(local_1a0,(LogicalType *)&local_198,&local_178);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_178);
  LogicalType::~LogicalType((LogicalType *)&local_198);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1b8);
  return local_1a0;
}

Assistant:

static Value GetParameterTypes(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto fun = entry.functions.GetFunctionByOffset(offset);
		for (idx_t i = 0; i < fun.arguments.size(); i++) {
			results.emplace_back(fun.arguments[i].ToString());
		}
		return Value::LIST(LogicalType::VARCHAR, std::move(results));
	}